

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O0

Context __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
::
RunConversion<mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>>
          (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this,IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
                 *con,int i,int depth)

{
  NodeRange src;
  bool bVar1;
  int in_ECX;
  ItemType *in_RSI;
  MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RDI;
  NodeRange NVar2;
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  auto_link_scope;
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_00000090;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  ItemType *in_stack_ffffffffffffffa0;
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_ffffffffffffffb0;
  BasicConstraint *in_stack_ffffffffffffffb8;
  Context in_stack_ffffffffffffffc4;
  Context local_28;
  Context local_24 [3];
  ItemType *local_18;
  CtxVal local_4;
  
  (in_RDI->
  super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ).constr_depth_ = in_ECX + 1;
  local_18 = in_RSI;
  bVar1 = BasicConstraint::UsesContext();
  if (bVar1) {
    local_24[0] = BasicConstraint::GetContext
                            ((BasicConstraint *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    bVar1 = Context::IsNone(local_24);
    if (bVar1) {
      Context::Context(&local_28,CTX_MIX);
      BasicConstraint::SetContext(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc4);
      in_stack_ffffffffffffffa0 = local_18;
    }
  }
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::GetConstraintKeeper
            (&in_RDI->
              super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ,(IndicatorConstraintQuadLE *)0x0);
  NVar2 = BasicConstraintKeeper::SelectValueNodeRange
                    ((BasicConstraintKeeper *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                     in_stack_ffffffffffffff98);
  src.ir_.beg_ = (int)NVar2.pvn_;
  src.pvn_ = (ValueNode *)in_stack_ffffffffffffffb8;
  src.ir_.end_ = NVar2.pvn_._4_4_;
  pre::
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::AutoLinkScope(in_stack_ffffffffffffffb0,
                  (FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                   *)in_RDI,src);
  local_4 = (CtxVal)MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    ::Convert(in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  pre::
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::~AutoLinkScope(in_stack_00000090);
  return (Context)local_4;
}

Assistant:

Context RunConversion(const Constraint& con, int i, int depth) {
    assert(
        !GET_CONSTRAINT_KEEPER(Constraint).IsRedundant(i));
    constr_depth_ = depth+1;
    if (con.UsesContext())              // If context relevant,
      if (con.GetContext().IsNone())    // ensure we have context, mixed if none
        con.SetContext(Context::CTX_MIX);
    pre::AutoLinkScope<Impl> auto_link_scope{
      *static_cast<Impl*>(this),
      GET_CONSTRAINT_KEEPER(Constraint).SelectValueNodeRange(i)
    };
    return MP_DISPATCH(Convert(con, i));
  }